

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix(SquareMatrix<double> *this,int64_t size)

{
  this->size_ = size;
  alloc_unique_array<double>((dense *)&this->data_,size * size);
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x2d,"qclab::dense::SquareMatrix<double>::SquareMatrix(const int64_t) [T = double]"
               );
}

Assistant:

SquareMatrix( const int64_t size )
        : size_( size )
        , data_( alloc_unique_array< T >( size * size ) )
        {
          assert( size > 0 ) ;
        }